

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# terminal.c
# Opt level: O0

void terminal_clear_EOL(EditLine *el,wchar_t num)

{
  wchar_t local_18;
  wchar_t i;
  wchar_t num_local;
  EditLine *el_local;
  
  if (((((el->el_terminal).t_flags & 4U) == 0) || ((el->el_terminal).t_str[3] == (char *)0x0)) ||
     (*(el->el_terminal).t_str[3] == '\0')) {
    for (local_18 = L'\0'; local_18 < num; local_18 = local_18 + L'\x01') {
      terminal__putc(el,0x20);
    }
    (el->el_cursor).h = num + (el->el_cursor).h;
  }
  else {
    terminal_tputs(el,(el->el_terminal).t_str[3],L'\x01');
  }
  return;
}

Assistant:

libedit_private void
terminal_clear_EOL(EditLine *el, int num)
{
	int i;

	if (EL_CAN_CEOL && GoodStr(T_ce))
		terminal_tputs(el, Str(T_ce), 1);
	else {
		for (i = 0; i < num; i++)
			terminal__putc(el, ' ');
		el->el_cursor.h += num;	/* have written num spaces */
	}
}